

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.c
# Opt level: O0

void quicly_streambuf_destroy(quicly_stream_t *stream,int err)

{
  void *__ptr;
  undefined4 in_ESI;
  long in_RDI;
  quicly_streambuf_t *sbuf;
  undefined4 in_stack_fffffffffffffff0;
  
  __ptr = *(void **)(in_RDI + 0xb0);
  quicly_sendbuf_dispose((quicly_sendbuf_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  ptls_buffer_dispose((ptls_buffer_t *)stream);
  free(__ptr);
  *(undefined8 *)(in_RDI + 0xb0) = 0;
  return;
}

Assistant:

void quicly_streambuf_destroy(quicly_stream_t *stream, int err)
{
    quicly_streambuf_t *sbuf = stream->data;

    quicly_sendbuf_dispose(&sbuf->egress);
    ptls_buffer_dispose(&sbuf->ingress);
    free(sbuf);
    stream->data = NULL;
}